

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::Iterator::Iterator
          (Iterator *this,SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *matrix,bool valid)

{
  size_t sVar1;
  byte in_DL;
  Iterator *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 0xffffffff;
  TripletRef::TripletRef
            ((TripletRef *)(in_RDI + 2),0xffffffffffffffff,0xffffffffffffffff,(double *)0x0);
  *(undefined4 *)(in_RDI + 4) = 1;
  sVar1 = VectorDynSize::size((VectorDynSize *)in_RSI);
  if ((sVar1 != 0) && ((in_DL & 1) != 0)) {
    *(undefined4 *)(in_RDI + 1) = 0;
    updateTriplet(in_RSI);
  }
  return;
}

Assistant:

SparseMatrix<ordering>::Iterator::Iterator(iDynTree::SparseMatrix<ordering> &matrix, bool valid)
    : m_matrix(matrix)
    , m_index(-1)
    , m_currentTriplet(-1, -1, 0)
    , m_nonZerosInOuterDirection(1) //to initialize the counter
    {
        if (matrix.m_values.size() == 0 || !valid) return;
        m_index = 0;

        updateTriplet();
    }